

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O1

Status __thiscall
leveldb::BuildTable(leveldb *this,string *dbname,Env *env,Options *options,TableCache *table_cache,
                   Iterator *iter,FileMetaData *meta)

{
  Rep *pRVar1;
  void *pvVar2;
  int iVar3;
  TableBuilder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _func_int **pp_Var4;
  Iterator *pIVar5;
  Snapshot *extraout_RDX;
  WritableFile *file;
  Slice key;
  string fname;
  WritableFile *local_a0;
  void *local_98;
  Snapshot *pSStack_90;
  Env *local_80;
  leveldb *local_78;
  TableCache *local_70;
  Slice local_68;
  string local_58;
  void *local_38;
  
  *(undefined8 *)this = 0;
  file[2]._vptr_WritableFile = (_func_int **)0x0;
  local_70 = table_cache;
  (*iter->_vptr_Iterator[3])(iter);
  TableFileName(&local_58,dbname,(uint64_t)file[1]._vptr_WritableFile);
  iVar3 = (*iter->_vptr_Iterator[2])(iter);
  if ((char)iVar3 != '\0') {
    (*env->_vptr_Env[4])(&local_98,env,&local_58,&local_a0);
    *(void **)this = local_98;
    if ((Rep *)local_98 != (Rep *)0x0) goto LAB_0012b809;
    local_80 = env;
    local_78 = this;
    this_00 = (TableBuilder *)operator_new(8);
    TableBuilder::TableBuilder(this_00,options,local_a0);
    iVar3 = (*iter->_vptr_Iterator[8])(iter);
    std::__cxx11::string::_M_replace
              ((ulong)(file + 3),0,(char *)file[4]._vptr_WritableFile,CONCAT44(extraout_var,iVar3));
    iVar3 = (*iter->_vptr_Iterator[2])(iter);
    if ((char)iVar3 != '\0') {
      do {
        iVar3 = (*iter->_vptr_Iterator[8])(iter);
        local_98 = (void *)CONCAT44(extraout_var_00,iVar3);
        pSStack_90 = extraout_RDX;
        std::__cxx11::string::_M_replace
                  ((ulong)(file + 7),0,(char *)file[8]._vptr_WritableFile,(ulong)local_98);
        iVar3 = (*iter->_vptr_Iterator[9])(iter);
        local_68.data_ = (char *)CONCAT44(extraout_var_01,iVar3);
        TableBuilder::Add(this_00,(Slice *)&local_98,&local_68);
        (*iter->_vptr_Iterator[6])(iter);
        iVar3 = (*iter->_vptr_Iterator[2])(iter);
      } while ((char)iVar3 != '\0');
    }
    TableBuilder::Finish((TableBuilder *)&local_98);
    this = local_78;
    pvVar2 = local_98;
    pRVar1 = *(Rep **)local_78;
    *(void **)local_78 = local_98;
    local_98 = pRVar1;
    if (pRVar1 != (Rep *)0x0) {
      operator_delete__(pRVar1);
    }
    if ((Rep *)pvVar2 == (Rep *)0x0) {
      pp_Var4 = (_func_int **)TableBuilder::FileSize(this_00);
      file[2]._vptr_WritableFile = pp_Var4;
      if (pp_Var4 == (_func_int **)0x0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
      (*local_a0->_vptr_WritableFile[5])(&local_98);
      *(void **)this = local_98;
    }
    else {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
    }
    env = local_80;
    if (*(long *)this == 0) {
      (*local_a0->_vptr_WritableFile[3])(&local_98);
      *(void **)this = local_98;
    }
    if (local_a0 != (WritableFile *)0x0) {
      (*local_a0->_vptr_WritableFile[1])();
    }
    local_a0 = (WritableFile *)0x0;
    if (*(long *)this == 0) {
      local_98 = (Rep *)0x100;
      pSStack_90 = (Snapshot *)0x0;
      pIVar5 = TableCache::NewIterator
                         (local_70,(ReadOptions *)&local_98,(uint64_t)file[1]._vptr_WritableFile,
                          (uint64_t)file[2]._vptr_WritableFile,(Table **)0x0);
      (*pIVar5->_vptr_Iterator[10])(&local_98,pIVar5);
      *(void **)this = local_98;
      (*pIVar5->_vptr_Iterator[1])(pIVar5);
    }
  }
  (*iter->_vptr_Iterator[10])(&local_98,iter);
  if ((Rep *)local_98 != (Rep *)0x0) {
    operator_delete__(local_98);
    (*iter->_vptr_Iterator[10])(&local_98,iter);
    pRVar1 = *(Rep **)this;
    *(void **)this = local_98;
    local_98 = pRVar1;
    if (pRVar1 != (Rep *)0x0) {
      operator_delete__(pRVar1);
    }
  }
  if (((*(long *)this != 0) || (file[2]._vptr_WritableFile == (_func_int **)0x0)) &&
     ((*env->_vptr_Env[8])(&local_38,env,&local_58), local_38 != (void *)0x0)) {
    operator_delete__(local_38);
  }
LAB_0012b809:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return (Status)(char *)this;
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->RemoveFile(fname);
  }
  return s;
}